

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pragma_user_agent.cpp
# Opt level: O2

unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
 duckdb::PragmaUserAgentInit(ClientContext *context,TableFunctionInitInput *input)

{
  DBConfig *this;
  pointer pPVar1;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::PragmaUserAgentData_*,_false> local_38;
  string local_30;
  
  make_uniq<duckdb::PragmaUserAgentData>();
  this = DBConfig::GetConfig((ClientContext *)input);
  DBConfig::UserAgent_abi_cxx11_(&local_30,this);
  pPVar1 = unique_ptr<duckdb::PragmaUserAgentData,_std::default_delete<duckdb::PragmaUserAgentData>,_true>
           ::operator->((unique_ptr<duckdb::PragmaUserAgentData,_std::default_delete<duckdb::PragmaUserAgentData>,_true>
                         *)&local_38);
  ::std::__cxx11::string::_M_assign((string *)&pPVar1->user_agent);
  ::std::__cxx11::string::~string((string *)&local_30);
  (context->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
  super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_38._M_head_impl;
  return (unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
          )(unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
            )context;
}

Assistant:

unique_ptr<GlobalTableFunctionState> PragmaUserAgentInit(ClientContext &context, TableFunctionInitInput &input) {
	auto result = make_uniq<PragmaUserAgentData>();
	auto &config = DBConfig::GetConfig(context);
	result->user_agent = config.UserAgent();

	return std::move(result);
}